

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

longlong __thiscall Net::automatch(Net *this)

{
  istream *piVar1;
  long lVar2;
  longlong lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  replys;
  string temp;
  string reply;
  string local_1f0;
  string request;
  stringstream stream;
  
  std::__cxx11::string::string((string *)&request,"AUTO ",(allocator *)&stream);
  reply._M_dataplus._M_p = (pointer)&reply.field_2;
  reply._M_string_length = 0;
  reply.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_1f0,(string *)&request);
  send_with_retry(this,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  lVar3 = -1;
  if (this->closed == 0) {
    read_with_retry(this,&reply);
    if (this->closed == 0) {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&stream,(string *)&reply,_S_out|_S_in);
      temp._M_dataplus._M_p = (pointer)&temp.field_2;
      temp._M_string_length = 0;
      temp.field_2._M_local_buf[0] = '\0';
      replys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      replys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      replys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while( true ) {
        piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stream,(string *)&temp,' ');
        if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
        if (temp._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&replys,&temp);
        }
      }
      lVar3 = 0;
      lVar2 = std::__cxx11::string::find
                        ((char *)replys.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0x10a742);
      if (lVar2 == -1) {
        lVar2 = std::__cxx11::string::find
                          ((char *)replys.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,0x10a747);
        if (lVar2 == -1) {
          this->closed = 1;
          lVar3 = -1;
        }
        else {
          lVar3 = std::__cxx11::stoll(replys.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10
                                     );
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&replys);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    }
  }
  std::__cxx11::string::~string((string *)&reply);
  std::__cxx11::string::~string((string *)&request);
  return lVar3;
}

Assistant:

long long Net::automatch(){
	std::string request="AUTO ";
	std::string reply;
	send_with_retry(request);
	if(closed)return -1;
	read_with_retry(reply);
	if(closed)return -1;

	std::stringstream stream(reply);
	std::string temp;
	std::vector<std::string> replys;
	while(std::getline(stream,temp,' ')){
		if(!temp.empty()){
			replys.push_back(temp);
		}
	}
	if(replys[0].find("HOST")!=std::string::npos){
		return 0;
	} else if(replys[0].find("GUEST")!=std::string::npos) return std::stoll(replys[1]);
	closed=1;
	return -1;
}